

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall
Lowerer::GenerateCheckForArgumentsLength
          (Lowerer *this,Instr *ldElem,LabelInstr *labelCreateHeapArgs,Opnd *actualParamOpnd,
          Opnd *valueOpnd,OpCode opcode)

{
  InsertCompare(actualParamOpnd,valueOpnd,ldElem);
  InsertBranch(opcode,true,labelCreateHeapArgs,ldElem);
  return;
}

Assistant:

void
Lowerer::GenerateCheckForArgumentsLength(IR::Instr* ldElem, IR::LabelInstr* labelCreateHeapArgs, IR::Opnd* actualParamOpnd, IR::Opnd* valueOpnd, Js::OpCode opcode)
{
    // Check if index < nr_actuals.
    InsertCompare(actualParamOpnd, valueOpnd, ldElem);
    // Jump to helper if index >= nr_actuals.
    // Do an unsigned check here so that a negative index will also fail.
    // (GenerateLdValueFromCheckedIndexOpnd does not guarantee positive index on x86.)
    InsertBranch(opcode, true, labelCreateHeapArgs, ldElem);
}